

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O2

bool __thiscall
pktalloc::LightVector<pktalloc::Allocator::WindowHeader_*,_25U>::SetSize_Copy
          (LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *this,uint elements)

{
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *__src;
  WindowHeader **__dest;
  uint uVar1;
  
  if (this->Allocated < elements) {
    uVar1 = elements * 3 >> 1;
    __dest = (WindowHeader **)operator_new__((ulong)uVar1 * 8,(nothrow_t *)&std::nothrow);
    if (__dest == (WindowHeader **)0x0) {
      return false;
    }
    __src = (LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *)this->DataPtr;
    this->Allocated = uVar1;
    this->DataPtr = __dest;
    memcpy(__dest,__src,(ulong)this->Size << 3);
    if (__src != (LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *)0x0 && __src != this) {
      operator_delete__(__src);
    }
  }
  this->Size = elements;
  return true;
}

Assistant:

bool SetSize_Copy(unsigned elements)
    {
        PKTALLOC_DEBUG_ASSERT(Size <= Allocated);

        // If it is actually expanding, and it needs to grow:
        if (elements > Allocated)
        {
            const unsigned newAllocated = (elements * 3) / 2;
            T* newData = new(std::nothrow) T[newAllocated];
            if (!newData) {
                return false;
            }
            T* oldData = DataPtr;
            Allocated  = newAllocated;
            DataPtr    = newData;

            // Copy data before deletion
            memcpy(newData, oldData, sizeof(T) * Size);

            if (oldData != &PreallocatedData[0]) {
                delete[] oldData;
            }
        }

        Size = elements;
        return true;
    }